

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

void opus_tags_clear(OpusTags *_tags)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char **__ptr;
  ulong uVar4;
  
  iVar3 = _tags->comments;
  __ptr = _tags->user_comments;
  uVar1 = (uint)(__ptr != (char **)0x0);
  uVar2 = iVar3 + uVar1;
  if (uVar2 != 0 && SCARRY4(iVar3,uVar1) == (int)uVar2 < 0) {
    uVar4 = (ulong)uVar2;
    iVar3 = iVar3 + (uint)(__ptr != (char **)0x0) + 1;
    do {
      uVar4 = uVar4 - 1;
      free(_tags->user_comments[uVar4 & 0xffffffff]);
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
    __ptr = _tags->user_comments;
  }
  free(__ptr);
  free(_tags->comment_lengths);
  free(_tags->vendor);
  return;
}

Assistant:

void opus_tags_clear(OpusTags *_tags){
  int ncomments;
  int ci;
  ncomments=_tags->comments;
  if(_tags->user_comments!=NULL)ncomments++;
  else{
    OP_ASSERT(ncomments==0);
  }
  for(ci=ncomments;ci-->0;)_ogg_free(_tags->user_comments[ci]);
  _ogg_free(_tags->user_comments);
  _ogg_free(_tags->comment_lengths);
  _ogg_free(_tags->vendor);
}